

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_gmsh.cpp
# Opt level: O2

void Omega_h::gmsh::anon_unknown_0::seek_line(istream *stream,string *want)

{
  __type _Var1;
  istream *piVar2;
  string line;
  
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) != 0) {
    fail("assertion %s failed at %s +%d\n","stream",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
         ,0x62);
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  do {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(stream,(string *)&line);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    _Var1 = std::operator==(&line,want);
  } while (!_Var1);
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) == 0) {
    std::__cxx11::string::~string((string *)&line);
    return;
  }
  fail("assertion %s failed at %s +%d\n","stream",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
       ,0x69);
}

Assistant:

void seek_line(std::istream& stream, std::string const& want) {
  OMEGA_H_CHECK(stream);
  std::string line;
  while (std::getline(stream, line)) {
    if (line == want) {
      break;
    }
  }
  OMEGA_H_CHECK(stream);
}